

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

void Curl_pgrsStartNow(Curl_easy *data)

{
  undefined1 *puVar1;
  int *piVar2;
  time_t tVar3;
  undefined8 uVar4;
  curltime now;
  
  (data->progress).speeder_c = 0;
  now = Curl_now();
  (data->progress).start.tv_sec = now.tv_sec;
  (data->progress).start.tv_usec = now.tv_usec;
  puVar1 = &(data->progress).field_0x184;
  *puVar1 = *puVar1 & 0xfd;
  tVar3 = (data->progress).start.tv_sec;
  uVar4 = *(undefined8 *)&(data->progress).start.tv_usec;
  (data->progress).ul_limit_start.tv_sec = tVar3;
  *(undefined8 *)&(data->progress).ul_limit_start.tv_usec = uVar4;
  (data->progress).dl_limit_start.tv_sec = tVar3;
  *(undefined8 *)&(data->progress).dl_limit_start.tv_usec = uVar4;
  (data->progress).ul_limit_size = 0;
  (data->progress).dl_limit_size = 0;
  (data->progress).downloaded = 0;
  (data->progress).uploaded = 0;
  piVar2 = &(data->progress).flags;
  *piVar2 = *piVar2 & 0x90;
  Curl_ratelimit(data,now);
  return;
}

Assistant:

void Curl_pgrsStartNow(struct Curl_easy *data)
{
  data->progress.speeder_c = 0; /* reset the progress meter display */
  data->progress.start = Curl_now();
  data->progress.is_t_startransfer_set = false;
  data->progress.ul_limit_start = data->progress.start;
  data->progress.dl_limit_start = data->progress.start;
  data->progress.ul_limit_size = 0;
  data->progress.dl_limit_size = 0;
  data->progress.downloaded = 0;
  data->progress.uploaded = 0;
  /* clear all bits except HIDE and HEADERS_OUT */
  data->progress.flags &= PGRS_HIDE|PGRS_HEADERS_OUT;
  Curl_ratelimit(data, data->progress.start);
}